

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-spbset.c
# Opt level: O0

uint_spbset_chunk * uint_spbset_get_chunk(uint_spbset *bset,uint i,_Bool grow)

{
  uint uVar1;
  uint_spbset_chunk **ppuStack_30;
  uint i_offset;
  uint_spbset_chunk **panchor;
  uint_spbset_chunk *chunk;
  _Bool grow_local;
  uint i_local;
  uint_spbset *bset_local;
  
  ppuStack_30 = (uint_spbset_chunk **)0x0;
  uVar1 = i & 0xffffff00;
  panchor = (uint_spbset_chunk **)bset;
  if (bset == (uint_spbset *)0x0) {
    bset_local = (uint_spbset *)0x0;
  }
  else {
    for (; panchor != (uint_spbset_chunk **)0x0; panchor = &(*panchor)->next) {
      if (*(uint *)(panchor + 5) == uVar1) {
        return (uint_spbset_chunk *)panchor;
      }
      if (uVar1 < *(uint *)(panchor + 5)) break;
      ppuStack_30 = panchor;
    }
    if (grow) {
      bset_local = (uint_spbset *)(*Curl_ccalloc)(1,0x30);
      if ((uint_spbset_chunk *)bset_local == (uint_spbset_chunk *)0x0) {
        bset_local = (uint_spbset *)0x0;
      }
      else {
        if (ppuStack_30 == (uint_spbset_chunk **)0x0) {
          memcpy(bset_local,bset,0x30);
          memset(bset,0,0x30);
          (bset->head).next = (uint_spbset_chunk *)bset_local;
        }
        else {
          ((uint_spbset_chunk *)bset_local)->next = *ppuStack_30;
          *ppuStack_30 = (uint_spbset_chunk *)bset_local;
        }
        ((uint_spbset_chunk *)bset_local)->offset = uVar1;
      }
    }
    else {
      bset_local = (uint_spbset *)0x0;
    }
  }
  return &bset_local->head;
}

Assistant:

static struct uint_spbset_chunk *
uint_spbset_get_chunk(struct uint_spbset *bset, unsigned int i, bool grow)
{
  struct uint_spbset_chunk *chunk, **panchor = NULL;
  unsigned int i_offset = (i & ~CURL_UINT_SPBSET_CH_MASK);

  if(!bset)
    return NULL;

  for(chunk = &bset->head; chunk;
      panchor = &chunk->next, chunk = chunk->next) {
    if(chunk->offset == i_offset) {
      return chunk;
    }
    else if(chunk->offset > i_offset) {
      /* need new chunk here */
      chunk = NULL;
      break;
    }
  }

  if(!grow)
    return NULL;

  /* need a new one */
  chunk = calloc(1, sizeof(*chunk));
  if(!chunk)
    return NULL;

  if(panchor) {  /* insert between panchor and *panchor */
    chunk->next = *panchor;
    *panchor = chunk;
  }
  else {  /* prepend to head, switching places */
    memcpy(chunk, &bset->head, sizeof(*chunk));
    memset(&bset->head, 0, sizeof(bset->head));
    bset->head.next = chunk;
  }
  chunk->offset = i_offset;
  return chunk;
}